

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O0

size_t __thiscall nuraft::FakeTimer::getNumPendingTasks(FakeTimer *this,int type)

{
  bool bVar1;
  int32 iVar2;
  element_type *this_00;
  int in_ESI;
  list<std::shared_ptr<nuraft::delayed_task>,_std::allocator<std::shared_ptr<nuraft::delayed_task>_>_>
  *in_RDI;
  ptr<delayed_task> *cur_task;
  shared_ptr<nuraft::delayed_task> *entry;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nuraft::delayed_task>,_std::allocator<std::shared_ptr<nuraft::delayed_task>_>_>
  *__range1;
  size_t count;
  lock_guard<std::mutex> l;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  _Self local_48;
  _Self local_40;
  _List_node_base **local_38;
  size_type local_30;
  undefined4 local_24;
  int local_14;
  size_type local_8;
  
  local_14 = in_ESI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (local_14 < 0) {
    local_8 = std::__cxx11::
              list<std::shared_ptr<nuraft::delayed_task>,_std::allocator<std::shared_ptr<nuraft::delayed_task>_>_>
              ::size(in_RDI);
  }
  else {
    local_30 = 0;
    local_38 = &in_RDI[3].
                super__List_base<std::shared_ptr<nuraft::delayed_task>,_std::allocator<std::shared_ptr<nuraft::delayed_task>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev;
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::delayed_task>,_std::allocator<std::shared_ptr<nuraft::delayed_task>_>_>
         ::begin((list<std::shared_ptr<nuraft::delayed_task>,_std::allocator<std::shared_ptr<nuraft::delayed_task>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::delayed_task>,_std::allocator<std::shared_ptr<nuraft::delayed_task>_>_>
         ::end((list<std::shared_ptr<nuraft::delayed_task>,_std::allocator<std::shared_ptr<nuraft::delayed_task>_>_>
                *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    while( true ) {
      bVar1 = std::operator!=(&local_40,&local_48);
      if (!bVar1) break;
      std::_List_iterator<std::shared_ptr<nuraft::delayed_task>_>::operator*
                ((_List_iterator<std::shared_ptr<nuraft::delayed_task>_> *)0x1b7ce0);
      this_00 = std::
                __shared_ptr_access<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b7cf9);
      iVar2 = delayed_task::get_type(this_00);
      if (iVar2 == local_14) {
        local_30 = local_30 + 1;
      }
      std::_List_iterator<std::shared_ptr<nuraft::delayed_task>_>::operator++(&local_40);
    }
    local_8 = local_30;
  }
  local_24 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b7d68);
  return local_8;
}

Assistant:

size_t FakeTimer::getNumPendingTasks(int type) {
    std::lock_guard<std::mutex> l(tasksLock);

    if (type < 0) {
        // Count all.
        return tasks.size();
    }

    size_t count = 0;
    for (auto& entry: tasks) {
        ptr<delayed_task>& cur_task = entry;
        if (cur_task->get_type() == type) count++;
    }
    return count;
}